

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IR.h
# Opt level: O1

void __thiscall
IR::MultiBranchInstr::MapMultiBrLabels<IR::Instr::Dump(IRDumpFlags)::__1>(MultiBranchInstr *this)

{
  Kind KVar1;
  long *plVar2;
  long lVar3;
  long lVar4;
  ulong uVar5;
  int iVar6;
  BranchDictionary *branchDictionary;
  long *plVar7;
  
  plVar2 = (long *)this->m_branchTargets;
  if (plVar2 == (long *)0x0) {
    return;
  }
  KVar1 = this->m_kind;
  if ((KVar1 == IntJumpTable) || (KVar1 == SingleCharStrJumpTable)) {
    plVar7 = plVar2 + 1;
    lVar4 = this->m_baseCaseValue;
    if (lVar4 <= this->m_lastCaseValue) {
      lVar3 = *plVar2;
      do {
        Output::Print(L"$L%d ",(ulong)*(uint *)(*(long *)(lVar3 + this->m_baseCaseValue * -8 +
                                                         lVar4 * 8) + 0x7c));
        lVar4 = lVar4 + 1;
      } while (lVar4 <= this->m_lastCaseValue);
    }
  }
  else {
    if (KVar1 != StrDictionary) {
      MapMultiBrLabels<IR::Instr::Dump(IRDumpFlags)::__1>();
      return;
    }
    plVar7 = plVar2 + 7;
    if (*(int *)((long)plVar2 + 0x1c) != 0) {
      uVar5 = 0;
      do {
        iVar6 = *(int *)(*plVar2 + uVar5 * 4);
        while (iVar6 != -1) {
          lVar4 = (long)iVar6;
          iVar6 = *(int *)(plVar2[1] + 8 + lVar4 * 0x18);
          Output::Print(L"$L%d ",(ulong)*(uint *)(*(long *)(plVar2[1] + lVar4 * 0x18) + 0x7c));
        }
        uVar5 = uVar5 + 1;
      } while (uVar5 < *(uint *)((long)plVar2 + 0x1c));
    }
  }
  Output::Print(L"$L%d ",(ulong)*(uint *)(*plVar7 + 0x7c));
  return;
}

Assistant:

void MapMultiBrLabels(Fn fn)
    {
        MapMultiBrTargetByAddress([fn](void ** value) -> void
        {
            fn((LabelInstr*) *value);
        });
    }